

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGBMultiplyRow_C(uint8_t *src_argb0,uint8_t *src_argb1,uint8_t *dst_argb,int width)

{
  undefined4 uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  ulong uVar9;
  undefined1 auVar10 [13];
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar15 [16];
  
  if (0 < width) {
    lVar11 = 0;
    do {
      uVar1 = *(undefined4 *)(src_argb0 + lVar11 * 4);
      uVar9 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
      auVar6._8_4_ = 0;
      auVar6._0_8_ = uVar9;
      auVar6[0xc] = (char)((uint)uVar1 >> 0x18);
      auVar7[8] = (char)((uint)uVar1 >> 0x10);
      auVar7._0_8_ = uVar9;
      auVar7[9] = 0;
      auVar7._10_3_ = auVar6._10_3_;
      auVar10._5_8_ = 0;
      auVar10._0_5_ = auVar7._8_5_;
      auVar13._0_4_ = (int)uVar9;
      auVar8[4] = (char)((uint)uVar1 >> 8);
      auVar8._0_4_ = auVar13._0_4_;
      auVar8[5] = 0;
      auVar8._6_7_ = SUB137(auVar10 << 0x40,6);
      auVar13._4_9_ = auVar8._4_9_;
      auVar13._13_3_ = 0;
      uVar1 = *(undefined4 *)(src_argb1 + lVar11 * 4);
      auVar15 = pshuflw(in_XMM4,auVar13,0xe8);
      auVar12._0_4_ = auVar13._0_4_ << 8;
      auVar12._4_4_ = auVar8._4_4_ << 8;
      auVar12._8_4_ = auVar7._8_4_ << 8;
      auVar12._12_4_ = (uint)(uint3)(auVar6._10_3_ >> 0x10) << 8;
      in_XMM4 = pshufhw(auVar15,auVar15,0xe8);
      auVar13 = pshuflw(auVar12,auVar12,0xe8);
      auVar13 = pshufhw(auVar13,auVar13,0xe8);
      auVar13 = auVar13 | in_XMM4;
      auVar15._0_4_ = auVar13._0_4_;
      auVar15._8_4_ = auVar13._8_4_;
      auVar15._12_4_ = auVar13._12_4_;
      auVar15._4_4_ = auVar15._8_4_;
      auVar14._8_8_ = 0;
      auVar14._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar1 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar1 >> 0x10),uVar1)) >>
                                                  0x20),uVar1) >> 0x18),
                                           CONCAT12((char)((uint)uVar1 >> 8),(short)uVar1)) >> 0x10)
                           ,(short)uVar1) & 0xffff00ff00ff00ff;
      auVar13 = pmulhuw(auVar14,auVar15);
      auVar13 = auVar13 & ZEXT816(0xff00ff00ff00ff);
      uVar2 = auVar13._0_2_;
      uVar3 = auVar13._2_2_;
      uVar4 = auVar13._4_2_;
      uVar5 = auVar13._6_2_;
      *(uint *)(dst_argb + lVar11 * 4) =
           CONCAT13((uVar5 != 0) * (uVar5 < 0x100) * auVar13[6] - (0xff < uVar5),
                    CONCAT12((uVar4 != 0) * (uVar4 < 0x100) * auVar13[4] - (0xff < uVar4),
                             CONCAT11((uVar3 != 0) * (uVar3 < 0x100) * auVar13[2] - (0xff < uVar3),
                                      (uVar2 != 0) * (uVar2 < 0x100) * auVar13[0] - (0xff < uVar2)))
                   );
      lVar11 = lVar11 + 1;
    } while (width != (int)lVar11);
  }
  return;
}

Assistant:

void ARGBMultiplyRow_C(const uint8_t* src_argb0,
                       const uint8_t* src_argb1,
                       uint8_t* dst_argb,
                       int width) {
  int i;
  for (i = 0; i < width; ++i) {
    const uint32_t b = REPEAT8(src_argb0[0]);
    const uint32_t g = REPEAT8(src_argb0[1]);
    const uint32_t r = REPEAT8(src_argb0[2]);
    const uint32_t a = REPEAT8(src_argb0[3]);
    const uint32_t b_scale = src_argb1[0];
    const uint32_t g_scale = src_argb1[1];
    const uint32_t r_scale = src_argb1[2];
    const uint32_t a_scale = src_argb1[3];
    dst_argb[0] = SHADE(b, b_scale);
    dst_argb[1] = SHADE(g, g_scale);
    dst_argb[2] = SHADE(r, r_scale);
    dst_argb[3] = SHADE(a, a_scale);
    src_argb0 += 4;
    src_argb1 += 4;
    dst_argb += 4;
  }
}